

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

wchar_t ma_itoa_s(wchar_t value,char *dst,size_t dstSizeInBytes,wchar_t radix)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  wchar_t wVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  if (dstSizeInBytes != 0 && dst != (char *)0x0) {
    if (0xffffffdc < (uint)(radix + L'\xffffffdb')) {
      uVar8 = (ulong)(uint)-value;
      if (L'\0' < value) {
        uVar8 = (ulong)(uint)value;
      }
      lVar9 = 0;
      lVar5 = 0;
      do {
        wVar7 = (wchar_t)uVar8;
        uVar2 = uVar8 % (ulong)(uint)radix;
        cVar4 = '0';
        if (9 < (int)uVar2) {
          cVar4 = 'W';
        }
        dst[lVar9] = cVar4 + (char)uVar2;
        lVar1 = lVar5 + -1;
        lVar9 = lVar9 + 1;
      } while ((1 - dstSizeInBytes != lVar5) &&
              (lVar5 = lVar1, uVar8 = uVar8 / (uint)radix, (uint)radix <= (uint)wVar7));
      if (dstSizeInBytes + lVar1 != 0) {
        if (L'\xffffffff' < value || radix != L'\n') {
          lVar5 = -lVar1;
        }
        else {
          lVar5 = 1 - lVar1;
          dst[lVar9] = '-';
        }
        if ((L'\xffffffff' < value || radix != L'\n') || 1 - dstSizeInBytes != lVar1) {
          dst[lVar5] = '\0';
          pcVar3 = dst + lVar5 + -1;
          if (pcVar3 <= dst) {
            return L'\0';
          }
          pcVar6 = dst + 1;
          do {
            cVar4 = pcVar6[-1];
            pcVar6[-1] = *pcVar3;
            *pcVar3 = cVar4;
            pcVar3 = pcVar3 + -1;
            bVar10 = pcVar6 < pcVar3;
            pcVar6 = pcVar6 + 1;
          } while (bVar10);
          return L'\0';
        }
      }
    }
    *dst = '\0';
  }
  return L'\x16';
}

Assistant:

MA_API int ma_itoa_s(int value, char* dst, size_t dstSizeInBytes, int radix)
{
    int sign;
    unsigned int valueU;
    char* dstEnd;

    if (dst == NULL || dstSizeInBytes == 0) {
        return 22;
    }
    if (radix < 2 || radix > 36) {
        dst[0] = '\0';
        return 22;
    }

    sign = (value < 0 && radix == 10) ? -1 : 1;     /* The negative sign is only used when the base is 10. */

    if (value < 0) {
        valueU = -value;
    } else {
        valueU = value;
    }

    dstEnd = dst;
    do
    {
        int remainder = valueU % radix;
        if (remainder > 9) {
            *dstEnd = (char)((remainder - 10) + 'a');
        } else {
            *dstEnd = (char)(remainder + '0');
        }

        dstEnd += 1;
        dstSizeInBytes -= 1;
        valueU /= radix;
    } while (dstSizeInBytes > 0 && valueU > 0);

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    if (sign < 0) {
        *dstEnd++ = '-';
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    *dstEnd = '\0';


    /* At this point the string will be reversed. */
    dstEnd -= 1;
    while (dst < dstEnd) {
        char temp = *dst;
        *dst = *dstEnd;
        *dstEnd = temp;

        dst += 1;
        dstEnd -= 1;
    }

    return 0;
}